

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O3

REF_STATUS ref_import_fgrid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_CELL pRVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  undefined8 uVar6;
  long lVar7;
  REF_GLOB n_global;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  REF_INT nnode;
  REF_INT ntri;
  REF_INT ntet;
  REF_INT new_cell;
  REF_INT face_id;
  REF_INT new_tri;
  REF_INT new_node;
  REF_DBL xyz;
  uint local_74;
  int local_70;
  int local_6c;
  undefined8 local_68;
  int iStack_60;
  int iStack_5c;
  int local_50;
  REF_INT local_4c;
  int local_48;
  uint local_44;
  long local_40;
  undefined8 local_38;
  
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0xab
             ,"ref_import_fgrid","unable to open file");
      return 2;
    }
    iVar4 = __isoc99_fscanf(__stream,"%d",&local_74);
    if (iVar4 == 1) {
      iVar4 = __isoc99_fscanf(__stream,"%d",&local_70);
      if (iVar4 == 1) {
        iVar4 = __isoc99_fscanf(__stream,"%d",&local_6c);
        if (iVar4 == 1) {
          n_global = (REF_GLOB)(int)local_74;
          if (0 < n_global) {
            uVar10 = 0;
            do {
              uVar3 = ref_node_add(ref_node,uVar10,(REF_INT *)&local_44);
              if (uVar3 != 0) {
                pcVar8 = "new_node";
                uVar6 = 0xb2;
                goto LAB_0015a3b2;
              }
              if (uVar10 != local_44) {
                pcVar8 = "node index";
                uVar6 = 0xb3;
                goto LAB_0015a561;
              }
              uVar10 = uVar10 + 1;
              n_global = (REF_GLOB)(int)local_74;
            } while ((long)uVar10 < n_global);
          }
          uVar3 = ref_node_initialize_n_global(ref_node,n_global);
          if (uVar3 == 0) {
            uVar10 = (ulong)local_74;
            lVar11 = 0;
            lVar7 = 0;
            do {
              lVar12 = lVar11;
              if (0 < (int)uVar10) {
                lVar9 = 0;
                local_40 = lVar11;
                do {
                  iVar4 = __isoc99_fscanf(__stream,"%lf",&local_38);
                  if (iVar4 != 1) {
                    pcVar8 = "xyz";
                    uVar6 = 0xba;
                    goto LAB_0015a561;
                  }
                  *(undefined8 *)((long)ref_node->real + lVar11) = local_38;
                  lVar9 = lVar9 + 1;
                  uVar10 = (ulong)(int)local_74;
                  lVar11 = lVar11 + 0x78;
                  lVar12 = local_40;
                } while (lVar9 < (long)uVar10);
              }
              lVar7 = lVar7 + 1;
              lVar11 = lVar12 + 8;
            } while (lVar7 != 3);
            pRVar2 = pRVar1->cell[3];
            iStack_5c = -1;
            if (0 < local_70) {
              iVar4 = 0;
              do {
                lVar7 = 0;
                do {
                  iVar5 = __isoc99_fscanf(__stream,"%d",(long)&local_68 + lVar7);
                  if (iVar5 != 1) {
                    pcVar8 = "tri";
                    uVar6 = 0xc2;
                    goto LAB_0015a561;
                  }
                  lVar7 = lVar7 + 4;
                } while (lVar7 != 0xc);
                local_68 = CONCAT44((int)((ulong)local_68 >> 0x20) + -1,(int)local_68 + -1);
                iStack_60 = iStack_60 + -1;
                uVar3 = ref_cell_add(pRVar2,(REF_INT *)&local_68,&local_48);
                if (uVar3 != 0) {
                  pcVar8 = "new tri";
                  uVar6 = 0xc6;
                  goto LAB_0015a3b2;
                }
                if (iVar4 != local_48) {
                  pcVar8 = "tri index";
                  uVar6 = 199;
                  goto LAB_0015a561;
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 < local_70);
              if (0 < local_70) {
                pRVar2 = pRVar1->cell[3];
                iVar4 = 0;
                do {
                  iVar5 = __isoc99_fscanf(__stream,"%d",&local_4c);
                  if (iVar5 != 1) {
                    pcVar8 = "tri id";
                    uVar6 = 0xcc;
                    goto LAB_0015a561;
                  }
                  pRVar2->c2n[(long)pRVar2->size_per * (long)iVar4 + 3] = local_4c;
                  iVar4 = iVar4 + 1;
                } while (iVar4 < local_70);
              }
            }
            if (0 < local_6c) {
              pRVar2 = pRVar1->cell[8];
              iVar4 = 0;
              do {
                lVar7 = 0;
                do {
                  iVar5 = __isoc99_fscanf(__stream,"%d",(long)&local_68 + lVar7);
                  if (iVar5 != 1) {
                    pcVar8 = "tet";
                    uVar6 = 0xd3;
                    goto LAB_0015a561;
                  }
                  lVar7 = lVar7 + 4;
                } while (lVar7 != 0x10);
                iStack_60 = iStack_60 + -1;
                iStack_5c = iStack_5c + -1;
                local_68 = CONCAT44(local_68._4_4_ + -1,(int)local_68 + -1);
                uVar3 = ref_cell_add(pRVar2,(REF_INT *)&local_68,&local_50);
                if (uVar3 != 0) {
                  pcVar8 = "new tet";
                  uVar6 = 0xd8;
                  goto LAB_0015a3b2;
                }
                if (iVar4 != local_50) {
                  pcVar8 = "tet index";
                  uVar6 = 0xd9;
                  goto LAB_0015a561;
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 < local_6c);
            }
            fclose(__stream);
            return 0;
          }
          pcVar8 = "init glob";
          uVar6 = 0xb6;
          goto LAB_0015a3b2;
        }
        pcVar8 = "ntet";
        uVar6 = 0xaf;
      }
      else {
        pcVar8 = "ntri";
        uVar6 = 0xae;
      }
    }
    else {
      pcVar8 = "nnode";
      uVar6 = 0xad;
    }
LAB_0015a561:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar6,
           "ref_import_fgrid",pcVar8);
    uVar3 = 1;
  }
  else {
    pcVar8 = "create grid";
    uVar6 = 0xa5;
LAB_0015a3b2:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar6,
           "ref_import_fgrid",(ulong)uVar3,pcVar8);
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_import_fgrid(REF_GRID *ref_grid_ptr,
                                           REF_MPI ref_mpi,
                                           const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *file;
  REF_INT nnode, ntri, ntet;
  REF_INT ixyz, node, new_node;
  REF_DBL xyz;
  REF_INT tri, new_tri;
  REF_INT nodes[4];
  REF_INT face_id;
  REF_INT cell, new_cell;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RES(1, fscanf(file, "%d", &nnode), "nnode");
  RES(1, fscanf(file, "%d", &ntri), "ntri");
  RES(1, fscanf(file, "%d", &ntet), "ntet");

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_add(ref_node, node, &new_node), "new_node");
    RES(node, new_node, "node index");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");

  for (ixyz = 0; ixyz < 3; ixyz++)
    for (node = 0; node < nnode; node++) {
      RES(1, fscanf(file, "%lf", &xyz), "xyz");
      ref_node_xyz(ref_node, ixyz, node) = xyz;
    }

  ref_cell = ref_grid_tri(ref_grid);
  nodes[3] = REF_EMPTY;
  for (tri = 0; tri < ntri; tri++) {
    for (node = 0; node < 3; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_tri), "new tri");
    RES(tri, new_tri, "tri index");
  }

  ref_cell = ref_grid_tri(ref_grid);
  for (tri = 0; tri < ntri; tri++) {
    RES(1, fscanf(file, "%d", &face_id), "tri id");
    ref_cell_c2n(ref_cell, 3, tri) = face_id;
  }

  ref_cell = ref_grid_tet(ref_grid);
  for (cell = 0; cell < ntet; cell++) {
    for (node = 0; node < 4; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tet");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new tet");
    RES(cell, new_cell, "tet index");
  }

  fclose(file);

  return REF_SUCCESS;
}